

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_block.cpp
# Opt level: O2

void __thiscall cppnet::BlockMemoryPool::ReleaseHalf(BlockMemoryPool *this)

{
  void *__ptr;
  void **ppvVar1;
  iterator __position;
  ulong uVar2;
  ulong uVar3;
  iterator iter;
  
  __position._M_current =
       (this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  ppvVar1 = (this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar3 = (long)ppvVar1 - (long)__position._M_current >> 3;
  uVar2 = uVar3 >> 1;
  while( true ) {
    uVar3 = uVar3 - 1;
    if (__position._M_current == ppvVar1) {
      return;
    }
    __ptr = *__position._M_current;
    __position = std::vector<void_*,_std::allocator<void_*>_>::erase
                           (&this->_free_mem_vec,__position._M_current);
    free(__ptr);
    ppvVar1 = (this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (__position._M_current == ppvVar1) break;
    if (uVar3 <= uVar2) {
      return;
    }
  }
  return;
}

Assistant:

void BlockMemoryPool::ReleaseHalf() {
#ifdef __use_iocp__
    std::lock_guard<std::mutex> lock(_mutex);
#endif
    size_t size = _free_mem_vec.size();
    size_t hale = size / 2;
    for (auto iter = _free_mem_vec.begin(); iter != _free_mem_vec.end();) {
        void* mem = *iter;

        iter = _free_mem_vec.erase(iter);
        free(mem);
        
        size--;
        if (iter == _free_mem_vec.end() || size <= hale) {
            break;
        }
    }
}